

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall S2BooleanOperation::Impl::GetIndexCrossings(Impl *this,int region_id)

{
  pointer *ppIVar1;
  IndexCrossing *pIVar2;
  iterator __position;
  ShapeEdgeId SVar3;
  long lVar4;
  ShapeEdgeId SVar5;
  int32 iVar6;
  ShapeEdgeId SVar7;
  bool bVar8;
  IndexCrossing *crossing;
  ulong uVar9;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  _Var10;
  pointer pIVar11;
  pointer pIVar12;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  if (this->index_crossings_first_region_id_ != region_id) {
    if (this->index_crossings_first_region_id_ < 0) {
      if (region_id != 0) {
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)&local_48,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x776,kFatal,(ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_48._8_8_,"Check failed: (region_id) == (0) ",0x21);
        abort();
      }
      local_48._8_8_ = 0;
      pcStack_30 = std::
                   _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1914:13)>
                   ::_M_invoke;
      local_38 = std::
                 _Function_handler<bool_(const_s2shapeutil::ShapeEdge_&,_const_s2shapeutil::ShapeEdge_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc:1914:13)>
                 ::_M_manager;
      local_48._M_unused._M_object = this;
      bVar8 = s2shapeutil::VisitCrossingEdgePairs
                        (this->op_->regions_[0],this->op_->regions_[1],ALL,
                         (EdgePairVisitor *)&local_48);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      if (!bVar8) {
        return false;
      }
      pIVar12 = (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar11 = (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar9 = ((long)pIVar11 - (long)pIVar12 >> 2) * -0x3333333333333333;
      if (1 < uVar9) {
        if (pIVar12 != pIVar11) {
          lVar4 = 0x3f;
          if (uVar9 != 0) {
            for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pIVar12,pIVar11,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pIVar12,pIVar11);
        }
        _Var10 = std::
                 __unique<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           ((this->index_crossings_).
                            super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->index_crossings_).
                            super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        pIVar2 = (this->index_crossings_).
                 super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((_Var10._M_current != pIVar2) &&
           (pIVar12 = (this->index_crossings_).
                      super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
           pIVar11 = (pointer)((long)_Var10._M_current + ((long)pIVar12 - (long)pIVar2)),
           pIVar12 != pIVar11)) {
          (this->index_crossings_).
          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
          ._M_impl.super__Vector_impl_data._M_finish = pIVar11;
        }
      }
      SVar5 = kSentinel;
      local_48._M_unused._M_object = (void *)kSentinel;
      local_48._8_4_ = kSentinel.shape_id;
      local_48._12_4_ = kSentinel.edge_id;
      local_38 = (code *)((ulong)local_38 & 0xfffffffffffffff8);
      __position._M_current =
           (this->index_crossings_).
           super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->index_crossings_).
          super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
        ::_M_realloc_insert<S2BooleanOperation::Impl::IndexCrossing>
                  (&this->index_crossings_,__position,(IndexCrossing *)&local_48);
      }
      else {
        *(undefined4 *)&(__position._M_current)->field_0x10 = local_38._0_4_;
        SVar7 = kSentinel;
        kSentinel.shape_id = SVar5.shape_id;
        kSentinel.edge_id = SVar5.edge_id;
        iVar6 = kSentinel.edge_id;
        ((__position._M_current)->a).shape_id = kSentinel.shape_id;
        kSentinel = SVar7;
        SVar7 = kSentinel;
        ((__position._M_current)->a).edge_id = iVar6;
        kSentinel.shape_id = SVar5.shape_id;
        kSentinel.edge_id = SVar5.edge_id;
        iVar6 = kSentinel.edge_id;
        ((__position._M_current)->b).shape_id = kSentinel.shape_id;
        kSentinel = SVar7;
        ((__position._M_current)->b).edge_id = iVar6;
        ppIVar1 = &(this->index_crossings_).
                   super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      this->index_crossings_first_region_id_ = 0;
    }
    if (this->index_crossings_first_region_id_ != region_id) {
      pIVar11 = (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pIVar12 = (this->index_crossings_).
                     super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                     ._M_impl.super__Vector_impl_data._M_start; pIVar12 != pIVar11;
          pIVar12 = pIVar12 + 1) {
        SVar3 = pIVar12->a;
        pIVar12->a = pIVar12->b;
        pIVar12->b = SVar3;
        pIVar12->field_0x10 = pIVar12->field_0x10 ^ 6;
      }
      pIVar12 = (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar11 = (this->index_crossings_).
                super__Vector_base<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar12 != pIVar11) {
        uVar9 = ((long)pIVar11 - (long)pIVar12 >> 2) * -0x3333333333333333;
        lVar4 = 0x3f;
        if (uVar9 != 0) {
          for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pIVar12,pIVar11,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pIVar12,pIVar11);
      }
      this->index_crossings_first_region_id_ = region_id;
    }
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::GetIndexCrossings(int region_id) {
  if (region_id == index_crossings_first_region_id_) return true;
  if (index_crossings_first_region_id_ < 0) {
    S2_DCHECK_EQ(region_id, 0);  // For efficiency, not correctness.
    if (!s2shapeutil::VisitCrossingEdgePairs(
            *op_->regions_[0], *op_->regions_[1],
            s2shapeutil::CrossingType::ALL,
            [this](const ShapeEdge& a, const ShapeEdge& b, bool is_interior) {
              // For all supported operations (union, intersection, and
              // difference), if the input edges have an interior crossing
              // then the output is guaranteed to have at least one edge.
              if (is_interior && is_boolean_output()) return false;
              return AddIndexCrossing(a, b, is_interior, &index_crossings_);
            })) {
      return false;
    }
    if (index_crossings_.size() > 1) {
      std::sort(index_crossings_.begin(), index_crossings_.end());
      index_crossings_.erase(
          std::unique(index_crossings_.begin(), index_crossings_.end()),
          index_crossings_.end());
    }
    // Add a sentinel value to simplify the loop logic.
    index_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
    index_crossings_first_region_id_ = 0;
  }
  if (region_id != index_crossings_first_region_id_) {
    for (auto& crossing : index_crossings_) {
      swap(crossing.a, crossing.b);
      // The following predicates get inverted when the edges are swapped.
      crossing.left_to_right ^= true;
      crossing.is_vertex_crossing ^= true;
    }
    std::sort(index_crossings_.begin(), index_crossings_.end());
    index_crossings_first_region_id_ = region_id;
  }
  return true;
}